

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

FreeFn __thiscall Js::JavascriptArrayBuffer::GetArrayBufferFreeFn(JavascriptArrayBuffer *this)

{
  JavascriptArrayBuffer *this_local;
  
  return ::free;
}

Assistant:

ArrayBuffer::FreeFn JavascriptArrayBuffer::GetArrayBufferFreeFn()
    {
#if ENABLE_FAST_ARRAYBUFFER
        if (IsValidVirtualBufferLength(bufferLength))
        {
            return FreeMemAlloc;
        }
        else
#endif
        {
            return free;
        }
    }